

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

void lj_cconv_ct_ct(CTState *cts,CType *d,CType *s,uint8_t *dp,uint8_t *sp,CTInfo flags)

{
  CType *pCVar1;
  int iVar2;
  float fVar3;
  int64_t i;
  ulong uVar4;
  double *******pppppppdVar5;
  byte bVar6;
  uint uVar7;
  undefined8 unaff_RBX;
  uint uVar8;
  uint uVar9;
  undefined8 unaff_RBP;
  size_t __n;
  undefined8 unaff_R12;
  float *__dest;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  uint uVar10;
  undefined8 unaff_R15;
  ulong __n_00;
  bool bVar11;
  double ******ppppppdVar12;
  undefined1 auVar13 [16];
  void *tmpptr;
  double *******local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  undefined8 uStack_8;
  
  uStack_30 = unaff_RBX;
  uStack_8 = unaff_RBP;
  uStack_28 = unaff_R12;
  uStack_20 = unaff_R13;
  uStack_18 = unaff_R14;
  uStack_10 = unaff_R15;
code_r0x0014aabe:
  uVar8 = d->info;
  uVar4 = (ulong)uVar8;
  if (0x3fffffff < uVar4) {
switchD_0014ab4c_caseD_3:
    cconv_err_conv(cts,d,s,flags);
  }
  uVar7 = s->info;
  if ((0x3fffffff < uVar7) ||
     (bVar6 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar7 >> 0x18) & 0x3c)) & 0xf) +
              ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar8 >> 0x18) & 0x3c)) & 0xf) * '\b',
     0x3f < bVar6)) goto switchD_0014ab4c_caseD_3;
  uVar10 = d->size;
  __n_00 = (ulong)uVar10;
  uVar9 = s->size;
  __n = (size_t)uVar9;
  pppppppdVar5 = (double *******)sp;
  switch(bVar6) {
  case 0:
    if (uVar10 == 1) {
      *dp = *sp;
      return;
    }
    fVar3 = (float)(uint)*sp;
    goto LAB_0014b090;
  case 1:
    if (uVar9 == 0) {
      bVar11 = false;
    }
    else {
      uVar4 = 0;
      bVar6 = 0;
      do {
        bVar6 = bVar6 | *(byte *)((long)sp + uVar4);
        uVar4 = uVar4 + 1;
      } while (__n != uVar4);
      bVar11 = bVar6 != 0;
    }
    if (uVar10 == 1) {
      *dp = bVar11;
      return;
    }
    fVar3 = (float)(uint)bVar11;
LAB_0014b090:
    *(float *)dp = fVar3;
    return;
  case 2:
    if (uVar9 == 4) {
      bVar11 = *(float *)sp != 0.0;
    }
    else {
      if (uVar9 != 8) goto switchD_0014ab4c_caseD_3;
      bVar11 = (double)*(double *******)sp != 0.0;
    }
    if (uVar10 == 1) {
      *dp = -bVar11 & 1U;
      return;
    }
    fVar3 = (float)(uint)(-bVar11 & 1U);
    goto LAB_0014b090;
  default:
    goto switchD_0014ab4c_caseD_3;
  case 8:
  case 9:
    goto switchD_0014ab4c_caseD_8;
  case 10:
    break;
  case 0xb:
    s = cts->tab + (uVar7 & 0xffff);
    uVar9 = s->size;
    break;
  case 0xd:
    uVar7 = 0x800000;
  case 0x29:
    if ((flags & 1) != 0) {
switchD_0014ab4c_caseD_8:
      uVar8 = (uint)__n;
      if (uVar10 < uVar8 || uVar10 - uVar8 == 0) {
        memcpy(dp,pppppppdVar5,__n_00);
        return;
      }
      if ((uVar7 >> 0x17 & 1) == 0) {
        uVar7 = (uint)(byte)(*(char *)((long)pppppppdVar5 + (ulong)(uVar8 - 1)) >> 7);
      }
      else {
        uVar7 = 0;
      }
      memcpy(dp,pppppppdVar5,__n);
      memset((byte *)((long)dp + __n),uVar7,(ulong)(uVar10 - uVar8));
      return;
    }
    goto switchD_0014ab4c_caseD_3;
  case 0xe:
    if ((flags & 1) != 0) {
      pppppppdVar5 = (double *******)&local_38;
      local_38 = (double *******)sp;
      __n = 8;
      uVar7 = 0x800000;
      goto switchD_0014ab4c_caseD_8;
    }
    goto switchD_0014ab4c_caseD_3;
  case 0x10:
  case 0x11:
    goto switchD_0014ab4c_caseD_10;
  case 0x12:
    goto switchD_0014ab4c_caseD_12;
  case 0x13:
    s = cts->tab + (uVar7 & 0xffff);
    uVar9 = s->size;
    goto switchD_0014ab4c_caseD_12;
  case 0x19:
    d = cts->tab + (uVar8 & 0xffff);
    uVar10 = d->size;
    memset((byte *)((long)dp + (ulong)uVar10),0,(ulong)uVar10);
switchD_0014ab4c_caseD_10:
    if ((uVar9 < 4) || ((uVar7 & 0x800000) == 0 && uVar9 == 4)) {
      if (uVar9 == 4) {
        fVar3 = *(float *)sp;
      }
      else if ((uVar7 >> 0x17 & 1) == 0) {
        if (uVar9 == 2) {
          fVar3 = (float)(int)*(short *)sp;
        }
        else {
          fVar3 = (float)(int)(char)*sp;
        }
      }
      else if (uVar9 == 2) {
        fVar3 = (float)(uint)*(ushort *)sp;
      }
      else {
        fVar3 = (float)(uint)*sp;
      }
      ppppppdVar12 = (double ******)(double)(int)fVar3;
    }
    else if (uVar9 == 4) {
      ppppppdVar12 = (double ******)(double)(uint)*(float *)sp;
    }
    else {
      if (uVar9 != 8) goto switchD_0014ab4c_caseD_3;
      ppppppdVar12 = *(double *******)sp;
      if ((uVar7 >> 0x17 & 1) == 0) {
        ppppppdVar12 = (double ******)(double)(long)ppppppdVar12;
      }
      else {
        auVar13._8_4_ = (int)((ulong)ppppppdVar12 >> 0x20);
        auVar13._0_8_ = ppppppdVar12;
        auVar13._12_4_ = 0x45300000;
        ppppppdVar12 = (double ******)
                       (((double)CONCAT44(0x43300000,(int)ppppppdVar12) - 4503599627370496.0) +
                       (auVar13._8_8_ - 1.9342813113834067e+25));
      }
    }
    if (uVar10 == 4) {
      *(float *)dp = (float)(double)ppppppdVar12;
      return;
    }
    goto LAB_0014afd7;
  case 0x1a:
    d = cts->tab + (uVar8 & 0xffff);
    __n_00 = (ulong)d->size;
    memset((byte *)((long)dp + __n_00),0,__n_00);
switchD_0014ab4c_caseD_12:
    uVar10 = (uint)__n_00;
    if (uVar9 == uVar10) {
LAB_0014af58:
      memcpy(dp,sp,__n_00);
      return;
    }
    if (uVar9 == 4) {
      ppppppdVar12 = (double ******)(double)*(float *)sp;
    }
    else {
      if (uVar9 != 8) goto switchD_0014ab4c_caseD_3;
      ppppppdVar12 = *(double *******)sp;
    }
    if (uVar10 == 4) {
      *(float *)dp = (float)(double)ppppppdVar12;
      return;
    }
LAB_0014afd7:
    if (uVar10 == 8) {
      *(double *******)dp = ppppppdVar12;
      return;
    }
    goto switchD_0014ab4c_caseD_3;
  case 0x1b:
    if (uVar10 == uVar9) goto LAB_0014af58;
    d = cts->tab + (uVar4 & 0xffff);
    s = cts->tab + ((ulong)uVar7 & 0xffff);
    lj_cconv_ct_ct(cts,d,s,dp,sp,flags);
    dp = (uint8_t *)((ulong)d->size + (long)dp);
    sp = (uint8_t *)((ulong)s->size + (long)sp);
    goto code_r0x0014aabe;
  case 0x21:
  case 0x22:
  case 0x23:
    pCVar1 = cts->tab;
    lj_cconv_ct_ct(cts,pCVar1 + (uVar8 & 0xffff),s,dp,sp,flags);
    uVar8 = pCVar1[uVar8 & 0xffff].size;
    __dest = (float *)dp;
    while (uVar8 < uVar10) {
      __dest = (float *)((long)__dest + (ulong)uVar8);
      memcpy(__dest,dp,(ulong)uVar8);
      uVar10 = (int)__n_00 - uVar8;
      __n_00 = (ulong)uVar10;
    }
    return;
  case 0x24:
    if (uVar10 == uVar9) goto LAB_0014af58;
    goto switchD_0014ab4c_caseD_3;
  case 0x2a:
    if ((~flags & 3) != 0) goto switchD_0014ab4c_caseD_3;
    uVar4 = (ulong)(uVar10 != 8) << 0x17;
    break;
  case 0x2d:
    iVar2 = lj_cconv_compatptr(cts,d,s,flags);
    if (iVar2 != 0) {
      if (uVar9 == 4) {
        pppppppdVar5 = (double *******)(ulong)(uint)*(float *)sp;
      }
      else {
        pppppppdVar5 = *(double ********)sp;
      }
      if (uVar10 == 4) {
        *(float *)dp = SUB84(pppppppdVar5,0);
        return;
      }
      goto LAB_0014b0ce;
    }
    goto switchD_0014ab4c_caseD_3;
  case 0x2e:
  case 0x2f:
    iVar2 = lj_cconv_compatptr(cts,d,s,flags);
    if (iVar2 != 0) {
      if (uVar10 == 4) {
        *(float *)dp = SUB84(sp,0);
        return;
      }
      goto LAB_0014b117;
    }
    goto switchD_0014ab4c_caseD_3;
  case 0x36:
    if ((((flags & 1) == 0) && ((uVar8 >> 0x14 & 1) == 0)) &&
       ((uVar10 != 0xffffffff &&
        ((uVar10 == uVar9 && (iVar2 = lj_cconv_compatptr(cts,d,s,flags), iVar2 != 0))))))
    goto LAB_0014af58;
    goto switchD_0014ab4c_caseD_3;
  case 0x3f:
    if ((((flags & 1) == 0) && (d == s)) && ((uVar8 & 0x100000) == 0)) goto LAB_0014af58;
    goto switchD_0014ab4c_caseD_3;
  }
  if (uVar9 == 4) {
    ppppppdVar12 = (double ******)(double)*(float *)sp;
  }
  else {
    if (uVar9 != 8) goto switchD_0014ab4c_caseD_3;
    ppppppdVar12 = *(double *******)sp;
  }
  if ((uVar10 < 4) || ((uVar4 & 0x800000) == 0 && uVar10 == 4)) {
    fVar3 = (float)(int)(double)ppppppdVar12;
    if (uVar10 == 2) {
      *(short *)dp = SUB42(fVar3,0);
      return;
    }
    if (uVar10 == 4) {
      *(float *)dp = fVar3;
      return;
    }
    *dp = SUB41(fVar3,0);
    return;
  }
  if (uVar10 == 4) {
    *(float *)dp = (float)(long)(double)ppppppdVar12;
    return;
  }
  if (uVar10 == 8) {
    pppppppdVar5 = (double *******)(long)(double)ppppppdVar12;
    if (((uint)uVar4 >> 0x17 & 1) != 0) {
      sp = (uint8_t *)(long)((double)ppppppdVar12 + -1.8446744073709552e+19);
      if (-1 < (long)pppppppdVar5) {
        sp = (uint8_t *)pppppppdVar5;
      }
LAB_0014b117:
      *(uint8_t **)dp = sp;
      return;
    }
LAB_0014b0ce:
    *(double ********)dp = pppppppdVar5;
    return;
  }
  goto switchD_0014ab4c_caseD_3;
}

Assistant:

void lj_cconv_ct_ct(CTState *cts, CType *d, CType *s,
		    uint8_t *dp, uint8_t *sp, CTInfo flags)
{
  CTSize dsize = d->size, ssize = s->size;
  CTInfo dinfo = d->info, sinfo = s->info;
  void *tmpptr;

  lj_assertCTS(!ctype_isenum(dinfo) && !ctype_isenum(sinfo),
	       "unresolved enum");
  lj_assertCTS(!ctype_isattrib(dinfo) && !ctype_isattrib(sinfo),
	       "unstripped attribute");

  if (ctype_type(dinfo) > CT_MAYCONVERT || ctype_type(sinfo) > CT_MAYCONVERT)
    goto err_conv;

  /* Some basic sanity checks. */
  lj_assertCTS(!ctype_isnum(dinfo) || dsize > 0, "bad size for number type");
  lj_assertCTS(!ctype_isnum(sinfo) || ssize > 0, "bad size for number type");
  lj_assertCTS(!ctype_isbool(dinfo) || dsize == 1 || dsize == 4,
	       "bad size for bool type");
  lj_assertCTS(!ctype_isbool(sinfo) || ssize == 1 || ssize == 4,
	       "bad size for bool type");
  lj_assertCTS(!ctype_isinteger(dinfo) || (1u<<lj_fls(dsize)) == dsize,
	       "bad size for integer type");
  lj_assertCTS(!ctype_isinteger(sinfo) || (1u<<lj_fls(ssize)) == ssize,
	       "bad size for integer type");

  switch (cconv_idx2(dinfo, sinfo)) {
  /* Destination is a bool. */
  case CCX(B, B):
    /* Source operand is already normalized. */
    if (dsize == 1) *dp = *sp; else *(int *)dp = *sp;
    break;
  case CCX(B, I): {
    MSize i;
    uint8_t b = 0;
    for (i = 0; i < ssize; i++) b |= sp[i];
    b = (b != 0);
    if (dsize == 1) *dp = b; else *(int *)dp = b;
    break;
    }
  case CCX(B, F): {
    uint8_t b;
    if (ssize == sizeof(double)) b = (*(double *)sp != 0);
    else if (ssize == sizeof(float)) b = (*(float *)sp != 0);
    else goto err_conv;  /* NYI: long double. */
    if (dsize == 1) *dp = b; else *(int *)dp = b;
    break;
    }

  /* Destination is an integer. */
  case CCX(I, B):
  case CCX(I, I):
  conv_I_I:
    if (dsize > ssize) {  /* Zero-extend or sign-extend LSB. */
#if LJ_LE
      uint8_t fill = (!(sinfo & CTF_UNSIGNED) && (sp[ssize-1]&0x80)) ? 0xff : 0;
      memcpy(dp, sp, ssize);
      memset(dp + ssize, fill, dsize-ssize);
#else
      uint8_t fill = (!(sinfo & CTF_UNSIGNED) && (sp[0]&0x80)) ? 0xff : 0;
      memset(dp, fill, dsize-ssize);
      memcpy(dp + (dsize-ssize), sp, ssize);
#endif
    } else {  /* Copy LSB. */
#if LJ_LE
      memcpy(dp, sp, dsize);
#else
      memcpy(dp, sp + (ssize-dsize), dsize);
#endif
    }
    break;
  case CCX(I, F): {
    double n;  /* Always convert via double. */
  conv_I_F:
    /* Convert source to double. */
    if (ssize == sizeof(double)) n = *(double *)sp;
    else if (ssize == sizeof(float)) n = (double)*(float *)sp;
    else goto err_conv;  /* NYI: long double. */
    /* Then convert double to integer. */
    /* The conversion must exactly match the semantics of JIT-compiled code! */
    if (dsize < 4 || (dsize == 4 && !(dinfo & CTF_UNSIGNED))) {
      int32_t i = (int32_t)n;
      if (dsize == 4) *(int32_t *)dp = i;
      else if (dsize == 2) *(int16_t *)dp = (int16_t)i;
      else *(int8_t *)dp = (int8_t)i;
    } else if (dsize == 4) {
      *(uint32_t *)dp = (uint32_t)n;
    } else if (dsize == 8) {
      if (!(dinfo & CTF_UNSIGNED))
	*(int64_t *)dp = (int64_t)n;
      else
	*(uint64_t *)dp = lj_num2u64(n);
    } else {
      goto err_conv;  /* NYI: conversion to >64 bit integers. */
    }
    break;
    }
  case CCX(I, C):
    s = ctype_child(cts, s);
    sinfo = s->info;
    ssize = s->size;
    goto conv_I_F;  /* Just convert re. */
  case CCX(I, P):
    if (!(flags & CCF_CAST)) goto err_conv;
    sinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    goto conv_I_I;
  case CCX(I, A):
    if (!(flags & CCF_CAST)) goto err_conv;
    sinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    ssize = CTSIZE_PTR;
    tmpptr = sp;
    sp = (uint8_t *)&tmpptr;
    goto conv_I_I;

  /* Destination is a floating-point number. */
  case CCX(F, B):
  case CCX(F, I): {
    double n;  /* Always convert via double. */
  conv_F_I:
    /* First convert source to double. */
    /* The conversion must exactly match the semantics of JIT-compiled code! */
    if (ssize < 4 || (ssize == 4 && !(sinfo & CTF_UNSIGNED))) {
      int32_t i;
      if (ssize == 4) {
	i = *(int32_t *)sp;
      } else if (!(sinfo & CTF_UNSIGNED)) {
	if (ssize == 2) i = *(int16_t *)sp;
	else i = *(int8_t *)sp;
      } else {
	if (ssize == 2) i = *(uint16_t *)sp;
	else i = *(uint8_t *)sp;
      }
      n = (double)i;
    } else if (ssize == 4) {
      n = (double)*(uint32_t *)sp;
    } else if (ssize == 8) {
      if (!(sinfo & CTF_UNSIGNED)) n = (double)*(int64_t *)sp;
      else n = (double)*(uint64_t *)sp;
    } else {
      goto err_conv;  /* NYI: conversion from >64 bit integers. */
    }
    /* Convert double to destination. */
    if (dsize == sizeof(double)) *(double *)dp = n;
    else if (dsize == sizeof(float)) *(float *)dp = (float)n;
    else goto err_conv;  /* NYI: long double. */
    break;
    }
  case CCX(F, F): {
    double n;  /* Always convert via double. */
  conv_F_F:
    if (ssize == dsize) goto copyval;
    /* Convert source to double. */
    if (ssize == sizeof(double)) n = *(double *)sp;
    else if (ssize == sizeof(float)) n = (double)*(float *)sp;
    else goto err_conv;  /* NYI: long double. */
    /* Convert double to destination. */
    if (dsize == sizeof(double)) *(double *)dp = n;
    else if (dsize == sizeof(float)) *(float *)dp = (float)n;
    else goto err_conv;  /* NYI: long double. */
    break;
    }
  case CCX(F, C):
    s = ctype_child(cts, s);
    sinfo = s->info;
    ssize = s->size;
    goto conv_F_F;  /* Ignore im, and convert from re. */

  /* Destination is a complex number. */
  case CCX(C, I):
    d = ctype_child(cts, d);
    dinfo = d->info;
    dsize = d->size;
    memset(dp + dsize, 0, dsize);  /* Clear im. */
    goto conv_F_I;  /* Convert to re. */
  case CCX(C, F):
    d = ctype_child(cts, d);
    dinfo = d->info;
    dsize = d->size;
    memset(dp + dsize, 0, dsize);  /* Clear im. */
    goto conv_F_F;  /* Convert to re. */

  case CCX(C, C):
    if (dsize != ssize) {  /* Different types: convert re/im separately. */
      CType *dc = ctype_child(cts, d);
      CType *sc = ctype_child(cts, s);
      lj_cconv_ct_ct(cts, dc, sc, dp, sp, flags);
      lj_cconv_ct_ct(cts, dc, sc, dp + dc->size, sp + sc->size, flags);
      return;
    }
    goto copyval;  /* Otherwise this is easy. */

  /* Destination is a vector. */
  case CCX(V, I):
  case CCX(V, F):
  case CCX(V, C): {
    CType *dc = ctype_child(cts, d);
    CTSize esize;
    /* First convert the scalar to the first element. */
    lj_cconv_ct_ct(cts, dc, s, dp, sp, flags);
    /* Then replicate it to the other elements (splat). */
    for (sp = dp, esize = dc->size; dsize > esize; dsize -= esize) {
      dp += esize;
      memcpy(dp, sp, esize);
    }
    break;
    }

  case CCX(V, V):
    /* Copy same-sized vectors, even for different lengths/element-types. */
    if (dsize != ssize) goto err_conv;
    goto copyval;

  /* Destination is a pointer. */
  case CCX(P, I):
    if (!(flags & CCF_CAST)) goto err_conv;
    dinfo = CTINFO(CT_NUM, CTF_UNSIGNED);
    goto conv_I_I;

  case CCX(P, F):
    if (!(flags & CCF_CAST) || !(flags & CCF_FROMTV)) goto err_conv;
    /* The signed conversion is cheaper. x64 really has 47 bit pointers. */
    dinfo = CTINFO(CT_NUM, (LJ_64 && dsize == 8) ? 0 : CTF_UNSIGNED);
    goto conv_I_F;

  case CCX(P, P):
    if (!lj_cconv_compatptr(cts, d, s, flags)) goto err_conv;
    cdata_setptr(dp, dsize, cdata_getptr(sp, ssize));
    break;

  case CCX(P, A):
  case CCX(P, S):
    if (!lj_cconv_compatptr(cts, d, s, flags)) goto err_conv;
    cdata_setptr(dp, dsize, sp);
    break;

  /* Destination is an array. */
  case CCX(A, A):
    if ((flags & CCF_CAST) || (d->info & CTF_VLA) || dsize != ssize ||
	d->size == CTSIZE_INVALID || !lj_cconv_compatptr(cts, d, s, flags))
      goto err_conv;
    goto copyval;

  /* Destination is a struct/union. */
  case CCX(S, S):
    if ((flags & CCF_CAST) || (d->info & CTF_VLA) || d != s)
      goto err_conv;  /* Must be exact same type. */
copyval:  /* Copy value. */
    lj_assertCTS(dsize == ssize, "value copy with different sizes");
    memcpy(dp, sp, dsize);
    break;

  default:
  err_conv:
    cconv_err_conv(cts, d, s, flags);
  }
}